

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O3

void __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::add_entry
          (relocation_section_accessor_template<ELFIO::section> *this,Elf64_Addr offset,
          Elf_Word symbol,uint type)

{
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var1;
  int iVar2;
  ulong uVar3;
  
  _Var1._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (elf_header *)0x0) {
    iVar2 = (*(_Var1._M_head_impl)->_vptr_elf_header[4])();
    if ((char)iVar2 == '\x01') {
      uVar3 = (ulong)symbol << 8;
      type = type & 0xff;
      goto LAB_00103d8f;
    }
  }
  uVar3 = (ulong)symbol << 0x20;
LAB_00103d8f:
  add_entry(this,offset,type | uVar3);
  return;
}

Assistant:

void add_entry( Elf64_Addr offset, Elf_Word symbol, unsigned type )
    {
        Elf_Xword info;
        if ( elf_file.get_class() == ELFCLASS32 ) {
            info = ELF32_R_INFO( (Elf_Xword)symbol, type );
        }
        else {
            info = ELF64_R_INFO( (Elf_Xword)symbol, type );
        }

        add_entry( offset, info );
    }